

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O0

void __thiscall
validation_block_tests::MinerTestingSetup::BuildChain
          (MinerTestingSetup *this,uint256 *root,int height,uint invalid_rate,uint branch_rate,
          uint max_size,
          vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
          *blocks)

{
  long lVar1;
  uint uVar2;
  size_type sVar3;
  uint in_ECX;
  int in_EDX;
  MinerTestingSetup *in_RSI;
  CBlockHeader *in_RDI;
  uint in_R8D;
  uint in_R9D;
  long in_FS_OFFSET;
  vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
  *unaff_retaddr;
  __shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_stack_00000008;
  bool gen_fork;
  bool gen_invalid;
  shared_ptr<const_CBlock> pblock;
  __shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff38;
  value_type *in_stack_ffffffffffffff40;
  vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
  *in_stack_ffffffffffffff48;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint uVar4;
  uint256 *in_stack_ffffffffffffff98;
  MinerTestingSetup *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((0 < in_EDX) &&
     (sVar3 = std::
              vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
              ::size((vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                      *)in_stack_ffffffffffffff38), sVar3 < in_R9D)) {
    uVar2 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                      (in_stack_ffffffffffffff60,(uint)((ulong)in_RDI >> 0x20));
    uVar4 = CONCAT13(uVar2 < in_ECX,(int3)in_stack_ffffffffffffff74);
    uVar2 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                      (in_stack_ffffffffffffff60,(uint)((ulong)in_RDI >> 0x20));
    uVar2 = CONCAT13((char)(uVar4 >> 0x18),CONCAT12(uVar2 < in_R8D,(short)uVar4));
    if ((uVar4 & 0x1000000) == 0) {
      GoodBlock((MinerTestingSetup *)CONCAT44(in_EDX,in_ECX),(uint256 *)CONCAT44(in_R8D,in_R9D));
    }
    else {
      BadBlock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
    push_back(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    if ((uVar2 & 0x1000000) == 0) {
      std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (in_stack_ffffffffffffff38);
      CBlockHeader::GetHash(in_RDI);
      in_stack_ffffffffffffff38 = in_stack_00000008;
      BuildChain(in_RSI,(uint256 *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,uVar2,
                 in_stack_ffffffffffffff70,unaff_retaddr);
    }
    if ((uVar2 & 0x10000) != 0) {
      GoodBlock((MinerTestingSetup *)CONCAT44(in_EDX,in_ECX),(uint256 *)CONCAT44(in_R8D,in_R9D));
      std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
      push_back((vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                 *)in_stack_ffffffffffffff38,(value_type *)0xcb4626);
      std::shared_ptr<const_CBlock>::~shared_ptr
                ((shared_ptr<const_CBlock> *)in_stack_ffffffffffffff38);
      std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
      back((vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_> *
           )in_stack_ffffffffffffff38);
      std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (in_stack_ffffffffffffff38);
      CBlockHeader::GetHash(in_RDI);
      BuildChain(in_RSI,(uint256 *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,uVar2,
                 in_stack_ffffffffffffff70,unaff_retaddr);
      in_stack_ffffffffffffff38 = in_stack_00000008;
    }
    std::shared_ptr<const_CBlock>::~shared_ptr
              ((shared_ptr<const_CBlock> *)in_stack_ffffffffffffff38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MinerTestingSetup::BuildChain(const uint256& root, int height, const unsigned int invalid_rate, const unsigned int branch_rate, const unsigned int max_size, std::vector<std::shared_ptr<const CBlock>>& blocks)
{
    if (height <= 0 || blocks.size() >= max_size) return;

    bool gen_invalid = m_rng.randrange(100U) < invalid_rate;
    bool gen_fork = m_rng.randrange(100U) < branch_rate;

    const std::shared_ptr<const CBlock> pblock = gen_invalid ? BadBlock(root) : GoodBlock(root);
    blocks.push_back(pblock);
    if (!gen_invalid) {
        BuildChain(pblock->GetHash(), height - 1, invalid_rate, branch_rate, max_size, blocks);
    }

    if (gen_fork) {
        blocks.push_back(GoodBlock(root));
        BuildChain(blocks.back()->GetHash(), height - 1, invalid_rate, branch_rate, max_size, blocks);
    }
}